

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O1

bool __thiscall
IR::Instr::
IterateArgInstrs<Inline::InlineApplyScriptTarget(IR::Instr*,FunctionJITTimeInfo_const*,FunctionJITTimeInfo_const**,FunctionJITTimeInfo_const*,StackSym_const*,IR::Instr**,unsigned_int,bool,unsigned_int)::__0>
          (Instr *this,anon_class_24_3_71b5c251 callback)

{
  OpCode OVar1;
  Opnd *pOVar2;
  _func_int **pp_Var3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  undefined1 uVar7;
  undefined1 extraout_AL;
  StackSym *pSVar8;
  undefined4 *puVar9;
  Instr *pIVar10;
  Instr *this_00;
  
  pSVar8 = Opnd::GetStackSym(this->m_src2);
  if (((pSVar8->field_0x18 & 1) == 0) || ((pSVar8->field_5).m_instrDef == (Instr *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar5) {
LAB_0055a3e5:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  this_00 = (pSVar8->field_5).m_instrDef;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if ((this_00->m_src2 == (Opnd *)0x0) ||
       (OVar6 = Opnd::GetKind(this_00->m_src2), OVar6 != OpndKindSym)) {
LAB_0055a2df:
      pIVar10 = (Instr *)0x0;
    }
    else {
      pOVar2 = this_00->m_src2;
      OVar6 = Opnd::GetKind(pOVar2);
      if (OVar6 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_0055a3e5;
        *puVar9 = 0;
      }
      pp_Var3 = pOVar2[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var3 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar5) goto LAB_0055a3e5;
        *puVar9 = 0;
      }
      if (((*(byte *)((long)pp_Var3 + 0x1a) & 0x10) != 0) && (*(short *)((long)pp_Var3 + 0x16) == 0)
         ) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar5) goto LAB_0055a3e5;
        *puVar9 = 0;
      }
      if ((*(byte *)((long)pp_Var3 + 0x1a) & 0x10) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar5) goto LAB_0055a3e5;
        *puVar9 = 0;
      }
      if ((((((ulong)pp_Var3[3] & 1) == 0) || (pp_Var3[5] == (_func_int *)0x0)) &&
          (bVar5 = Func::IsInPhase(this->m_func,FGPeepsPhase), !bVar5)) &&
         (bVar5 = Func::IsInPhase(this->m_func,FGBuildPhase), !bVar5)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1bf,
                           "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                           ,
                           "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                          );
        if (!bVar5) goto LAB_0055a3e5;
        *puVar9 = 0;
      }
      if (((ulong)pp_Var3[3] & 1) == 0) goto LAB_0055a2df;
      pIVar10 = (Instr *)pp_Var3[5];
    }
    OVar1 = this_00->m_opcode;
    uVar7 = (undefined1)OVar1;
    if (OVar1 != ArgOut_A_InlineSpecialized) {
      if (OVar1 == StartCall) {
        if (pIVar10 == (Instr *)0x0) {
          return (bool)uVar7;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
        if (bVar5) {
          *puVar9 = 0;
          return bVar5;
        }
        goto LAB_0055a3e5;
      }
      *callback.argumentsObjArgOut = *callback.explicitThisArgOut;
      *callback.explicitThisArgOut = *callback.implicitThisArgOut;
      *callback.implicitThisArgOut = this_00;
      GenerateBytecodeArgOutCapture(this_00);
      pOVar2 = this_00->m_dst;
      OVar6 = Opnd::GetKind(pOVar2);
      if (OVar6 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_0055a3e5;
        *puVar9 = 0;
      }
      pSVar8 = Opnd::GetStackSym(pOVar2);
      StackSym::DecrementArgSlotNum(pSVar8);
      uVar7 = extraout_AL;
    }
    this_00 = pIVar10;
    if (pIVar10 == (Instr *)0x0) {
      return (bool)uVar7;
    }
  } while( true );
}

Assistant:

bool IterateArgInstrs(Fn callback)
    {
        StackSym* linkSym = this->GetSrc2()->GetStackSym();
        Assert(linkSym->IsSingleDef());
        IR::Instr *argInstr = linkSym->m_instrDef;
        IR::Instr* nextArg = nullptr;
        do
        {
            // Get the next instr before calling 'callback' since callback might modify the IR.
            if (argInstr->GetSrc2() && argInstr->GetSrc2()->IsSymOpnd())
            {
                linkSym = argInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym();
                Assert(linkSym->IsArgSlotSym());

                // Due to dead code elimination in FGPeeps, it is possible for the definitions of the
                // the instructions that we are visiting during FG to have been freed. In this case,
                // the ArgSlot, even though its was a single def, will report IsSingleDef() as false
                // since instrDef is reset to nullptr when the def instr is freed
                Assert(linkSym->IsSingleDef() ||
                    (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)));
                nextArg = linkSym->GetInstrDef();
            }
            else
            {
                nextArg = nullptr;
            }
            if(argInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)
            {
                argInstr = nextArg;
                // This is a fake ArgOut, skip it
                continue;
            }
            if (argInstr->m_opcode == Js::OpCode::StartCall)
            {
                Assert(nextArg == nullptr);
                break;
            }

            if(callback(argInstr))
            {
                return true;
            }
            argInstr = nextArg;
        } while(argInstr && !argInstr->IsInvalidInstr());

        // If an instr in the call sequence is invalid (0xFDFDFDFD), it must have been freed.
        // This is possible if some dead-code-removal/peeps code removed only part of the call sequence, while the whole sequence was dead (TH Bug 594245).
        // We allow this possibility here, while relying on the more involved dead-code-removal to remove the rest of the call sequence.
        // Inserting the opcode InvalidOpCode, with no lowering, here to safeguard against the possibility of a dead part of the call sequence not being removed. The lowerer would assert then.
        if (argInstr && argInstr->IsInvalidInstr())
        {
            this->InsertBefore(Instr::New(Js::OpCode::InvalidOpCode, this->m_func));
        }
        return false;
    }